

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

int16_t __thiscall
helics::CommonCore::getIntegerProperty(CommonCore *this,LocalFederateId federateID,int32_t property)

{
  string_view message;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  size_t sVar4;
  FederateState *pFVar5;
  undefined8 uVar6;
  int in_EDX;
  LocalFederateId in_ESI;
  undefined8 in_RDI;
  LocalFederateId unaff_retaddr;
  FederateState *fed;
  FederateState *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_fffffffffffffffc;
  undefined2 in_stack_fffffffffffffffe;
  int16_t iVar7;
  
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  bVar1 = LocalFederateId::operator==
                    ((LocalFederateId *)&stack0xfffffffffffffff8,(LocalFederateId)0xfffffefd);
  if (bVar1) {
    if ((in_EDX == 0x10f) || (in_EDX == 0x112)) {
      peVar3 = CLI::std::
               __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x46be55);
      iVar2 = LogManager::getConsoleLevel(peVar3);
      iVar7 = (int16_t)iVar2;
    }
    else if (in_EDX == 0x110) {
      peVar3 = CLI::std::
               __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x46be86);
      iVar2 = LogManager::getFileLevel(peVar3);
      iVar7 = (int16_t)iVar2;
    }
    else if (in_EDX == 0x114) {
      peVar3 = CLI::std::
               __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x46beb7);
      LogManager::getLogBuffer(peVar3);
      sVar4 = LogBuffer::capacity((LogBuffer *)0x46bec7);
      iVar7 = (int16_t)sVar4;
    }
    else {
      iVar7 = 0;
    }
  }
  else {
    pFVar5 = getFederateAt((CommonCore *)
                           CONCAT26(in_stack_fffffffffffffffe,
                                    CONCAT24(in_stack_fffffffffffffffc,in_ESI.fid)),unaff_retaddr);
    if (pFVar5 == (FederateState *)0x0) {
      uVar6 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
      message._M_len._4_4_ = in_ESI.fid;
      message._M_len._0_4_ = in_stack_ffffffffffffffd8;
      message._M_str = (char *)pFVar5;
      InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_ffffffffffffffd0,message);
      __cxa_throw(uVar6,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    iVar2 = FederateState::getIntegerProperty(in_stack_ffffffffffffffc8,iVar2);
    iVar7 = (int16_t)iVar2;
  }
  return iVar7;
}

Assistant:

int16_t CommonCore::getIntegerProperty(LocalFederateId federateID, int32_t property) const
{
    if (federateID == gLocalCoreId) {
        if (property == HELICS_PROPERTY_INT_LOG_LEVEL ||
            property == HELICS_PROPERTY_INT_CONSOLE_LOG_LEVEL) {
            return mLogManager->getConsoleLevel();
        }
        if (property == HELICS_PROPERTY_INT_FILE_LOG_LEVEL) {
            return mLogManager->getFileLevel();
        }
        if (property == HELICS_PROPERTY_INT_LOG_BUFFER) {
            return static_cast<int16_t>(mLogManager->getLogBuffer().capacity());
        }
        return 0;
    }
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (setTimeDelta)"));
    }
    return fed->getIntegerProperty(property);
}